

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetRanges
          (CharSet<char16_t> *this,ArenaAllocator *allocator,int numSortedPairs,Char *sortedPairs)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_2c;
  int i;
  Char *sortedPairs_local;
  int numSortedPairs_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  local_2c = 0;
  do {
    if (SBORROW4(local_2c,numSortedPairs * 2) == local_2c + numSortedPairs * -2 < 0) {
      return;
    }
    if ((local_2c != 0) && ((ushort)sortedPairs[local_2c] <= (ushort)sortedPairs[local_2c + -1])) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x46b,"(i == 0 || sortedPairs[i-1] < sortedPairs[i])",
                         "i == 0 || sortedPairs[i-1] < sortedPairs[i]");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if ((ushort)sortedPairs[local_2c + 1] < (ushort)sortedPairs[local_2c]) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x46c,"(sortedPairs[i] <= sortedPairs[i+1])",
                         "sortedPairs[i] <= sortedPairs[i+1]");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    SetRange(this,allocator,sortedPairs[local_2c],sortedPairs[local_2c + 1]);
    local_2c = local_2c + 2;
  } while( true );
}

Assistant:

void CharSet<char16>::SetRanges(ArenaAllocator* allocator, int numSortedPairs, const Char* sortedPairs)
    {
        for (int i = 0; i < numSortedPairs * 2; i += 2)
        {
            Assert(i == 0 || sortedPairs[i-1] < sortedPairs[i]);
            Assert(sortedPairs[i] <= sortedPairs[i+1]);
            SetRange(allocator, sortedPairs[i], sortedPairs[i+1]);
        }
    }